

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall
AmpIO::GetWriteData(AmpIO *this,quadlet_t *buf,uint offset,uint numQuads,bool doSwap)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[3])();
  if (uVar2 >> 2 < numQuads + offset) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AmpIO:GetWriteData: invalid args: ",0x22);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else if (numQuads != 0) {
    uVar4 = 0;
    do {
      uVar1 = this->WriteBuffer[offset + uVar4];
      uVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if (!doSwap) {
        uVar5 = uVar1;
      }
      buf[uVar4] = uVar5;
      uVar4 = uVar4 + 1;
    } while (numQuads != uVar4);
  }
  return numQuads + offset <= uVar2 >> 2;
}

Assistant:

bool AmpIO::GetWriteData(quadlet_t *buf, unsigned int offset, unsigned int numQuads, bool doSwap) const
{
    unsigned int WriteBufSize = GetWriteNumBytes() / sizeof(quadlet_t);
    if ((offset+numQuads) > WriteBufSize) {
        std::cerr << "AmpIO:GetWriteData: invalid args: " << offset << ", " << numQuads << std::endl;
        return false;
    }

    for (size_t i = 0; i < numQuads; i++)
        buf[i] = doSwap ? bswap_32(WriteBuffer[offset+i]) : WriteBuffer[offset+i];
    return true;
}